

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void Js::JavascriptOperators::SetAttributes
               (RecyclableObject *object,PropertyId propId,PropertyDescriptor *descriptor,bool force
               )

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2666,"(object)","object");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (descriptor->valueSpecified == false && descriptor->writableSpecified == false) {
    bVar3 = descriptor->setterSpecified | descriptor->getterSpecified;
  }
  else {
    uVar6 = 0;
    if (descriptor->writableSpecified == false) goto LAB_00acb2db;
    bVar3 = PropertyDescriptor::IsWritable(descriptor);
  }
  uVar6 = (ulong)bVar3;
LAB_00acb2db:
  if ((force) || (descriptor->configurableSpecified == true)) {
    uVar5 = 0;
    if (descriptor->configurableSpecified == true) {
      bVar2 = PropertyDescriptor::IsConfigurable(descriptor);
      uVar5 = (ulong)bVar2;
    }
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3c])(object,propId,uVar5);
  }
  if ((force) || (descriptor->enumerableSpecified == true)) {
    uVar5 = 0;
    if (descriptor->enumerableSpecified == true) {
      bVar2 = PropertyDescriptor::IsEnumerable(descriptor);
      uVar5 = (ulong)bVar2;
    }
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3d])(object,propId,uVar5);
  }
  if (((!force) && ((int)uVar6 == 0)) && (descriptor->writableSpecified == false)) {
    return;
  }
  (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
    [0x3b])(object,propId,uVar6);
  return;
}

Assistant:

void JavascriptOperators::SetAttributes(RecyclableObject* object, PropertyId propId, const PropertyDescriptor& descriptor, bool force)
    {
        Assert(object);

        BOOL isWritable = FALSE;
        if (descriptor.IsDataDescriptor())
        {
            isWritable = descriptor.WritableSpecified() ? descriptor.IsWritable() : FALSE;
        }
        else if (descriptor.IsAccessorDescriptor())
        {
            // The reason is that JavascriptOperators::OP_SetProperty checks for VarTo<RecyclableObject>(instance)->IsWritableOrAccessor(propertyId),
            // which should in fact check for 'is writable or accessor' but since there is no GetAttributes, we can't do that efficiently.
            isWritable = TRUE;
        }

        // CONSIDER: call object->SetAttributes which is much more efficient as that's 1 call instead of 3.
        //       Can't do that now as object->SetAttributes doesn't provide a way which attributes to modify and which not.
        if (force || descriptor.ConfigurableSpecified())
        {
            object->SetConfigurable(propId, descriptor.ConfigurableSpecified() ? descriptor.IsConfigurable() : FALSE);
        }
        if (force || descriptor.EnumerableSpecified())
        {
            object->SetEnumerable(propId, descriptor.EnumerableSpecified() ? descriptor.IsEnumerable() : FALSE);
        }
        if (force || descriptor.WritableSpecified() || isWritable)
        {
            object->SetWritable(propId, isWritable);
        }
    }